

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3VdbeSorterRowkey(VdbeCursor *pCsr,Mem *pOut)

{
  undefined2 uVar1;
  int n;
  void *__src;
  int iVar2;
  int iVar3;
  long lVar4;
  undefined8 *puVar5;
  int *piVar6;
  
  if (pCsr->pVtabCursor == (sqlite3_vtab_cursor *)0x0) {
    puVar5 = (undefined8 *)pCsr->seqCount;
    piVar6 = (int *)(puVar5 + 1);
  }
  else {
    lVar4 = (long)*(int *)((long)&pCsr->pVtabCursor->pVtab + 4) * 0x40;
    piVar6 = (int *)(*(long *)&pCsr->nullRow + lVar4 + 0x14);
    puVar5 = (undefined8 *)(lVar4 + *(long *)&pCsr->nullRow + 0x28);
  }
  n = *piVar6;
  __src = (void *)*puVar5;
  iVar2 = sqlite3VdbeMemGrow(pOut,n,0);
  iVar3 = 7;
  if (iVar2 == 0) {
    pOut->n = n;
    uVar1 = pOut->flags;
    pOut->flags = uVar1 & 0xbe00 | 0x10;
    memcpy(pOut->z,__src,(long)n);
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeSorterRowkey(const VdbeCursor *pCsr, Mem *pOut){
  VdbeSorter *pSorter = pCsr->pSorter;
  void *pKey; int nKey;           /* Sorter key to copy into pOut */

  pKey = vdbeSorterRowkey(pSorter, &nKey);
  if( sqlite3VdbeMemGrow(pOut, nKey, 0) ){
    return SQLITE_NOMEM;
  }
  pOut->n = nKey;
  MemSetTypeFlag(pOut, MEM_Blob);
  memcpy(pOut->z, pKey, nKey);

  return SQLITE_OK;
}